

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateBase.hpp
# Opt level: O0

PipelineResourceSignatureImplType * __thiscall
Diligent::PipelineStateBase<Diligent::EngineVkImplTraits>::GetResourceSignature
          (PipelineStateBase<Diligent::EngineVkImplTraits> *this,Uint32 Index)

{
  Char *Message;
  PipelineResourceSignatureVkImpl *pPVar1;
  undefined1 local_38 [8];
  string msg;
  Uint32 Index_local;
  PipelineStateBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._12_4_ = Index;
  CheckPipelineReady(this);
  if ((uint)this->m_SignatureCount <= (uint)msg.field_2._12_4_) {
    FormatString<char[26],char[25]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Index < m_SignatureCount",
               (char (*) [25])(ulong)this->m_SignatureCount);
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetResourceSignature",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/PipelineStateBase.hpp"
               ,0x2d7);
    std::__cxx11::string::~string((string *)local_38);
  }
  pPVar1 = Diligent::RefCntAutoPtr::operator_cast_to_PipelineResourceSignatureVkImpl_
                     ((RefCntAutoPtr *)(this->m_Signatures + (uint)msg.field_2._12_4_));
  return pPVar1;
}

Assistant:

GetResourceSignature(Uint32 Index) const override final
    {
        CheckPipelineReady();
        VERIFY_EXPR(Index < m_SignatureCount);
        return m_Signatures[Index];
    }